

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

void ValueType::RunUnitTests(void)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  ValueType VVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 other;
  undefined4 *puVar6;
  char *message;
  char *error;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar7;
  size_t j;
  long lVar8;
  uint lineNumber;
  ObjectType objectType;
  TypeId arrayTypeId;
  TypeId typeId;
  size_t sVar9;
  anon_class_1_0_00000001 local_65;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  anon_class_8_1_54a39806 local_60;
  ValueType m_3;
  undefined6 uStack_56;
  ValueType m;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [2];
  ValueType TaggedInt;
  ValueType IntAndLikelyTagged;
  ValueType IntAndLikelyUntagged;
  
  local_36.bits = Int|CanBeTaggedValue;
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       Verify(IntCanBeUntagged|Int|CanBeTaggedValue);
  local_34.field_0 = aVar3.field_0;
  aVar4.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       Verify(IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
  local_32[0].field_0 = aVar4.field_0;
  bVar2 = IsNumber((ValueType *)&local_36.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6da,"(TaggedInt.IsNumber())","TaggedInt.IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyNumber((ValueType *)&local_36.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6db,"(TaggedInt.IsLikelyNumber())","TaggedInt.IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsPrimitive((ValueType *)&local_36.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6dc,"(TaggedInt.IsPrimitive())","TaggedInt.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive((ValueType *)&local_36.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6dd,"(TaggedInt.IsLikelyPrimitive())","TaggedInt.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (aVar3 == (Int|CanBeTaggedValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(!IntAndLikelyTagged.IsTaggedInt())";
    message = "!IntAndLikelyTagged.IsTaggedInt()";
    lineNumber = 0x6df;
LAB_009ef15c:
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,lineNumber,error,message);
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  else {
    if (((ushort)aVar3 & 0xffbf) != 0x28) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e0,"(IntAndLikelyTagged.IsIntAndLikelyTagged())",
                         "IntAndLikelyTagged.IsIntAndLikelyTagged()");
      if (!bVar2) goto LAB_009f1eec;
      *puVar6 = 0;
    }
    if (((ushort)aVar3 & 0xfdbe) != 0x28) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e1,"(IntAndLikelyTagged.IsLikelyTaggedInt())",
                         "IntAndLikelyTagged.IsLikelyTaggedInt()");
      if (!bVar2) goto LAB_009f1eec;
      *puVar6 = 0;
    }
    if (((ushort)aVar3 & 0xfdf6) == 0xe0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e2,"(!IntAndLikelyTagged.IsLikelyUntaggedInt())",
                         "!IntAndLikelyTagged.IsLikelyUntaggedInt()");
      if (!bVar2) goto LAB_009f1eec;
      *puVar6 = 0;
    }
    if (((ushort)aVar3 & 0xff37) != 0x20) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e3,"(IntAndLikelyTagged.IsInt())","IntAndLikelyTagged.IsInt()");
      if (!bVar2) goto LAB_009f1eec;
      *puVar6 = 0;
    }
    if (((ushort)aVar3 & 0xfd36) != 0x20) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e4,"(IntAndLikelyTagged.IsLikelyInt())",
                         "IntAndLikelyTagged.IsLikelyInt()");
      if (!bVar2) goto LAB_009f1eec;
      *puVar6 = 0;
    }
    if (((ushort)aVar3 & 0xfd14) == 0x100) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      error = "(!IntAndLikelyTagged.IsLikelyFloat())";
      message = "!IntAndLikelyTagged.IsLikelyFloat()";
      lineNumber = 0x6e5;
      goto LAB_009ef15c;
    }
  }
  bVar2 = IsNumber((ValueType *)&local_34.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e6,"(IntAndLikelyTagged.IsNumber())","IntAndLikelyTagged.IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyNumber((ValueType *)&local_34.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e7,"(IntAndLikelyTagged.IsLikelyNumber())",
                       "IntAndLikelyTagged.IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsPrimitive((ValueType *)&local_34.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e8,"(IntAndLikelyTagged.IsPrimitive())",
                       "IntAndLikelyTagged.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive((ValueType *)&local_34.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e9,"(IntAndLikelyTagged.IsLikelyPrimitive())",
                       "IntAndLikelyTagged.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar5.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6eb,"(GetNumberAndLikelyInt(true).IsLikelyTaggedInt())",
                       "GetNumberAndLikelyInt(true).IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar5.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ec,"(!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt())",
                       "!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar5.field_0 & 0xff37) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ed,"(!GetNumberAndLikelyInt(true).IsInt())",
                       "!GetNumberAndLikelyInt(true).IsInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar5.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ee,"(GetNumberAndLikelyInt(true).IsLikelyInt())",
                       "GetNumberAndLikelyInt(true).IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ef,"(!GetNumberAndLikelyInt(true).IsLikelyFloat())",
                       "!GetNumberAndLikelyInt(true).IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f0,"(GetNumberAndLikelyInt(true).IsNumber())",
                       "GetNumberAndLikelyInt(true).IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f1,"(GetNumberAndLikelyInt(true).IsLikelyNumber())",
                       "GetNumberAndLikelyInt(true).IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f2,"(GetNumberAndLikelyInt(true).IsPrimitive())",
                       "GetNumberAndLikelyInt(true).IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(true);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f3,"(GetNumberAndLikelyInt(true).IsLikelyPrimitive())",
                       "GetNumberAndLikelyInt(true).IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  if (((ushort)VVar5.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f5,"(TaggedInt.ToLikely().IsLikelyTaggedInt())",
                       "TaggedInt.ToLikely().IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  if (((ushort)VVar5.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f6,"(!TaggedInt.ToLikely().IsLikelyUntaggedInt())",
                       "!TaggedInt.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  if (((ushort)VVar5.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f7,"(TaggedInt.ToLikely().IsLikelyInt())",
                       "TaggedInt.ToLikely().IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f8,"(!TaggedInt.ToLikely().IsLikelyFloat())",
                       "!TaggedInt.ToLikely().IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f9,"(TaggedInt.ToLikely().IsLikelyNumber())",
                       "TaggedInt.ToLikely().IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fa,"(!TaggedInt.ToLikely().IsPrimitive())",
                       "!TaggedInt.ToLikely().IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_36.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fb,"(TaggedInt.ToLikely().IsLikelyPrimitive())",
                       "TaggedInt.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  if (((ushort)VVar5.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fd,"(IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  if (((ushort)VVar5.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fe,"(!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt())",
                       "!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  if (((ushort)VVar5.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ff,"(IntAndLikelyTagged.ToLikely().IsLikelyInt())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x700,"(!IntAndLikelyTagged.ToLikely().IsLikelyFloat())",
                       "!IntAndLikelyTagged.ToLikely().IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x701,"(IntAndLikelyTagged.ToLikely().IsLikelyNumber())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x702,"(!IntAndLikelyTagged.ToLikely().IsPrimitive())",
                       "!IntAndLikelyTagged.ToLikely().IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_34.field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x703,"(IntAndLikelyTagged.ToLikely().IsLikelyPrimitive())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x705,"(!IntAndLikelyUntagged.IsLikelyTaggedInt())",
                       "!IntAndLikelyUntagged.IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xfff7) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x706,"(IntAndLikelyUntagged.IsIntAndLikelyUntagged())",
                       "IntAndLikelyUntagged.IsIntAndLikelyUntagged()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x707,"(IntAndLikelyUntagged.IsLikelyUntaggedInt())",
                       "IntAndLikelyUntagged.IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xff37) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x708,"(IntAndLikelyUntagged.IsInt())","IntAndLikelyUntagged.IsInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x709,"(IntAndLikelyUntagged.IsLikelyInt())",
                       "IntAndLikelyUntagged.IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if (((ushort)aVar4 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70a,"(!IntAndLikelyUntagged.IsLikelyFloat())",
                       "!IntAndLikelyUntagged.IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNumber((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70b,"(IntAndLikelyUntagged.IsNumber())","IntAndLikelyUntagged.IsNumber()")
    ;
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyNumber((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70c,"(IntAndLikelyUntagged.IsLikelyNumber())",
                       "IntAndLikelyUntagged.IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsPrimitive((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70d,"(IntAndLikelyUntagged.IsPrimitive())",
                       "IntAndLikelyUntagged.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70e,"(IntAndLikelyUntagged.IsLikelyPrimitive())",
                       "IntAndLikelyUntagged.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x710,"(!GetNumberAndLikelyInt(false).IsLikelyTaggedInt())",
                       "!GetNumberAndLikelyInt(false).IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xfff7) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x711,"(!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged())",
                       "!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x712,"(GetNumberAndLikelyInt(false).IsLikelyUntaggedInt())",
                       "GetNumberAndLikelyInt(false).IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xff37) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x713,"(!GetNumberAndLikelyInt(false).IsInt())",
                       "!GetNumberAndLikelyInt(false).IsInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x714,"(GetNumberAndLikelyInt(false).IsLikelyInt())",
                       "GetNumberAndLikelyInt(false).IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x715,"(!GetNumberAndLikelyInt(false).IsLikelyFloat())",
                       "!GetNumberAndLikelyInt(false).IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x716,"(GetNumberAndLikelyInt(false).IsNumber())",
                       "GetNumberAndLikelyInt(false).IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x717,"(GetNumberAndLikelyInt(false).IsLikelyNumber())",
                       "GetNumberAndLikelyInt(false).IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x718,"(GetNumberAndLikelyInt(false).IsPrimitive())",
                       "GetNumberAndLikelyInt(false).IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = GetNumberAndLikelyInt(false);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x719,"(GetNumberAndLikelyInt(false).IsLikelyPrimitive())",
                       "GetNumberAndLikelyInt(false).IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  if (((ushort)VVar5.field_0 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71b,"(!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt())",
                       "!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  if (((ushort)VVar5.field_0 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71c,"(IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  if (((ushort)VVar5.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71d,"(IntAndLikelyUntagged.ToLikely().IsLikelyInt())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71e,"(!IntAndLikelyUntagged.ToLikely().IsLikelyFloat())",
                       "!IntAndLikelyUntagged.ToLikely().IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71f,"(IntAndLikelyUntagged.ToLikely().IsLikelyNumber())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x720,"(!IntAndLikelyUntagged.ToLikely().IsPrimitive())",
                       "!IntAndLikelyUntagged.ToLikely().IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely((ValueType *)&local_32[0].field_0);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x721,"(IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNumber(&Float);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x726,"(Float.IsNumber())","Float.IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyNumber(&Float);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x727,"(Float.IsLikelyNumber())","Float.IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsPrimitive(&Float);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x728,"(Float.IsPrimitive())","Float.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive(&Float);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x729,"(Float.IsLikelyPrimitive())","Float.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  if (((ushort)VVar5.field_0 & 0xfd36) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72b,"(!Float.ToLikely().IsLikelyInt())","!Float.ToLikely().IsLikelyInt()")
    ;
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  if (((ushort)VVar5.field_0 & 0xfd14) != 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72c,"(Float.ToLikely().IsLikelyFloat())",
                       "Float.ToLikely().IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72d,"(Float.ToLikely().IsLikelyNumber())",
                       "Float.ToLikely().IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72e,"(!Float.ToLikely().IsPrimitive())","!Float.ToLikely().IsPrimitive()")
    ;
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72f,"(!Float.ToLikely().IsPrimitive())","!Float.ToLikely().IsPrimitive()")
    ;
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Float);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x730,"(Float.ToLikely().IsLikelyPrimitive())",
                       "Float.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNumber(&Number);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x734,"(Number.IsNumber())","Number.IsNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyNumber(&Number);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x736,"(Number.IsLikelyNumber())","Number.IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsPrimitive(&Number);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x737,"(Number.IsPrimitive())","Number.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive(&Number);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x738,"(Number.IsLikelyPrimitive())","Number.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  if (((ushort)VVar5.field_0 & 0xfd36) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73a,"(!Number.ToLikely().IsLikelyInt())",
                       "!Number.ToLikely().IsLikelyInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  if (((ushort)VVar5.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73b,"(!Number.ToLikely().IsLikelyFloat())",
                       "!Number.ToLikely().IsLikelyFloat()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyNumber(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73c,"(Number.ToLikely().IsLikelyNumber())",
                       "Number.ToLikely().IsLikelyNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  if (((ushort)VVar5.field_0 & 0xfff4) != 0x200) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73d,"(Number.ToLikely().IsLikelyUnknownNumber())",
                       "Number.ToLikely().IsLikelyUnknownNumber()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73e,"(!Number.ToLikely().IsPrimitive())",
                       "!Number.ToLikely().IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Number);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73f,"(Number.ToLikely().IsLikelyPrimitive())",
                       "Number.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive(&UninitializedObject);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x741,"(!UninitializedObject.IsLikelyPrimitive())",
                       "!UninitializedObject.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&UninitializedObject);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsLikelyPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x745,"(!UninitializedObject.ToLikely().IsLikelyPrimitive())",
                       "!UninitializedObject.ToLikely().IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&UninitializedObject);
  if (((ushort)VVar5.field_0 & 0x17) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x746,"(!UninitializedObject.ToLikely().IsObject())",
                       "!UninitializedObject.ToLikely().IsObject()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&UninitializedObject);
  if (((ushort)VVar5.field_0 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x747,"(UninitializedObject.ToLikely().IsLikelyObject())",
                       "UninitializedObject.ToLikely().IsLikelyObject()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNotInt(&Undefined);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x749,"(Undefined.IsNotInt())","Undefined.IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Undefined);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNotInt(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74a,"(!Undefined.ToLikely().IsNotInt())",
                       "!Undefined.ToLikely().IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNotInt(&Null);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74b,"(Null.IsNotInt())","Null.IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Null);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNotInt(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74c,"(!Null.ToLikely().IsNotInt())","!Null.ToLikely().IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNotInt(&Boolean);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74d,"(Boolean.IsNotInt())","Boolean.IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&Boolean);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNotInt(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74e,"(!Boolean.ToLikely().IsNotInt())","!Boolean.ToLikely().IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNotInt(&String);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74f,"(String.IsNotInt())","String.IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&String);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNotInt(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x750,"(!String.ToLikely().IsNotInt())","!String.ToLikely().IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsNotInt(&UninitializedObject);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x751,"(UninitializedObject.IsNotInt())","UninitializedObject.IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  VVar5 = ToLikely(&UninitializedObject);
  _m_3 = CONCAT62(uStack_56,VVar5.field_0);
  bVar2 = IsNotInt(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x752,"(!UninitializedObject.ToLikely().IsNotInt())",
                       "!UninitializedObject.ToLikely().IsNotInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  aVar4 = local_32[0];
  Verify((ValueType)local_32[0].field_0);
  Verify((ValueType)0x4);
  aVar3.bits = Null;
  if (aVar4.bits != Null) {
    ValueType(&m_3,aVar4.bits | Null);
    aVar3 = m_3.field_0;
    if ((_m_3 & 0x10) == 0) {
      Verify(m_3);
    }
    else {
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_32[0].field_0,(ValueType)0x4);
    }
  }
  _m_3 = CONCAT62(uStack_56,aVar3.bits);
  bVar2 = IsPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x756,"(m.IsPrimitive())","m.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsLikelyPrimitive(&m_3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x757,"(m.IsLikelyPrimitive())","m.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf((ValueType *)&local_32[0].field_0,(ValueType)aVar3.field_0,true,true,true,true)
  ;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x758,"(IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true))",
                       "IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf(&m_3,(ValueType)aVar4.field_0,true,true,true,true);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x759,"(!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true))",
                       "!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  Verify((ValueType)aVar4.field_0);
  Verify((ValueType)0x10);
  if (aVar4.bits == Object) {
    _m_3 = CONCAT62(uStack_56,0x10);
    aVar3.bits = Object;
LAB_009f16a8:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x75e,"(m.HasBeenInt())","m.HasBeenInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  else {
    ValueType(&m_3,aVar4.bits | Object);
    aVar3 = m_3.field_0;
    if ((_m_3 & 0x10) == 0) {
      Verify(m_3);
    }
    else {
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_32[0].field_0,(ValueType)0x10);
    }
    _m_3 = CONCAT62(uStack_56,aVar3.bits);
    if ((aVar3.bits & (Int|Object)) != Int) goto LAB_009f16a8;
  }
  bVar2 = IsLikelyPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x75f,"(!m.IsLikelyPrimitive())","!m.IsLikelyPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if ((aVar3.bits & (PrimitiveOrObject|Object)) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x760,"(m.HasBeenObject())","m.HasBeenObject()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if ((aVar3.bits & Object) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x761,"(!m.IsLikelyObject())","!m.IsLikelyObject()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  aVar4 = local_34;
  Verify((ValueType)0x9);
  Verify((ValueType)aVar4.field_0);
  aVar3.bits = CanBeTaggedValue|Likely;
  if (aVar4.bits != (CanBeTaggedValue|Likely)) {
    ValueType(&m_3,aVar4.bits | (CanBeTaggedValue|Likely));
    aVar3 = m_3.field_0;
    if ((_m_3 & 0x10) == 0) {
      Verify(m_3);
    }
    else {
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject(&Uninitialized,aVar4.field_0);
    }
  }
  _m_3 = CONCAT62(uStack_56,aVar3.bits);
  bVar2 = IsPrimitive(&m_3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x766,"(!m.IsPrimitive())","!m.IsPrimitive()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if ((aVar3.bits & Likely) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x767,"(!m.IsDefinite())","!m.IsDefinite()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  if ((aVar3.bits & ~(Number|IntCanBeUntagged|Likely)) != (Int|CanBeTaggedValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x768,"(m.IsLikelyTaggedInt())","m.IsLikelyTaggedInt()");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  Verify((ValueType)0x10);
  Verify((ValueType)0x4);
  ValueType(&m_3,Object|Null);
  aVar3 = m_3.field_0;
  if ((_m_3 & 0x10) == 0) {
    Verify(m_3);
  }
  else {
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         MergeWithObject(&UninitializedObject,(ValueType)0x4);
  }
  local_60.f._0_2_ = aVar3.field_0;
  bVar2 = IsSubsetOf(&UninitializedObject,(ValueType)aVar3.field_0,true,true,true,true);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76d,"(UninitializedObject.IsSubsetOf(m, true, true, true, true))",
                       "UninitializedObject.IsSubsetOf(m, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf((ValueType *)&local_60,(ValueType)0x10,true,true,true,true);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76e,"(!m.IsSubsetOf(UninitializedObject, true, true, true, true))",
                       "!m.IsSubsetOf(UninitializedObject, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf(&Null,(ValueType)aVar3.field_0,true,true,true,true);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76f,"(Null.IsSubsetOf(m, true, true, true, true))",
                       "Null.IsSubsetOf(m, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf((ValueType *)&local_60,(ValueType)0x4,true,true,true,true);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x770,"(!m.IsSubsetOf(Null, true, true, true, true))",
                       "!m.IsSubsetOf(Null, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf((ValueType *)&local_36.field_0,(ValueType)aVar3.field_0,true,true,true,true);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x771,"(!TaggedInt.IsSubsetOf(m, true, true, true, true))",
                       "!TaggedInt.IsSubsetOf(m, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  aVar4 = local_36;
  bVar2 = IsSubsetOf((ValueType *)&local_60,(ValueType)local_36.field_0,true,true,true,true);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x772,"(!m.IsSubsetOf(TaggedInt, true, true, true, true))",
                       "!m.IsSubsetOf(TaggedInt, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  Verify((ValueType)aVar3.field_0);
  Verify((ValueType)aVar4.field_0);
  other = aVar3;
  if (aVar3.bits != aVar4.bits) {
    ValueType(&m_3,aVar4.bits | aVar3.bits);
    other = m_3.field_0;
    if ((_m_3 & 0x10) == 0) {
      Verify(m_3);
    }
    else {
      other.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_60,aVar4.field_0);
    }
  }
  _m_3 = CONCAT62(uStack_56,other.bits);
  bVar2 = IsSubsetOf((ValueType *)&local_60,(ValueType)other.field_0,true,true,true,true);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x775,"(m.IsSubsetOf(po, true, true, true, true))",
                       "m.IsSubsetOf(po, true, true, true, true)");
    if (!bVar2) goto LAB_009f1eec;
    *puVar6 = 0;
  }
  bVar2 = IsSubsetOf(&m_3,(ValueType)aVar3.field_0,true,true,true,true);
  sVar7 = extraout_RDX;
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x776,"(!po.IsSubsetOf(m, true, true, true, true))",
                       "!po.IsSubsetOf(m, true, true, true, true)");
    if (!bVar2) {
LAB_009f1eec:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    sVar7 = extraout_RDX_00;
  }
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(ValueType)0x0,sVar7);
  local_60.f = &local_65;
  MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
  ::anon_class_8_1_54a39806::operator()(&local_60,(ValueType)0x28,0);
  VVar5 = Verify(IntCanBeUntagged|Int|CanBeTaggedValue);
  MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
  ::anon_class_8_1_54a39806::operator()(&local_60,VVar5,1);
  VVar5 = Verify(IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
  MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
  ::anon_class_8_1_54a39806::operator()(&local_60,VVar5,2);
  _m_3 = 0x208010800280009;
  sVar7 = 3;
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 1) {
    VVar5.field_0 =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(&m_3)[lVar8].field_0.field_0;
    if ((0x28 < (ulong)(ushort)VVar5.field_0) ||
       (sVar9 = sVar7, (0x10000010200U >> ((ulong)(ushort)VVar5.field_0 & 0x3f) & 1) == 0)) {
      sVar9 = sVar7 + 1;
      MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
      ::anon_class_8_1_54a39806::operator()(&local_60,VVar5,sVar7);
    }
    sVar7 = sVar9;
  }
  for (objectType = UninitializedObject; objectType != Count; objectType = objectType + Object) {
    if ((ushort)(objectType - Int8Array) < 0xfffe) {
      VVar5 = GetObject(objectType);
      sVar9 = sVar7 + 1;
      MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
      ::anon_class_8_1_54a39806::operator()(&local_60,VVar5,sVar7);
    }
    else {
      sVar9 = sVar7;
      for (typeId = TypeIds_Array; typeId != TypeIds_ArrayLastWithES5;
          typeId = typeId + TypeIds_Null) {
        sVar7 = sVar9;
        if (objectType != ObjectWithArray || typeId == TypeIds_Array) {
          lVar8 = 0;
          while( true ) {
            sVar7 = sVar9 + lVar8;
            if ((short)lVar8 == 2) break;
            local_62.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 GetObject(objectType);
            local_64.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 SetHasNoMissingValues((ValueType *)&local_62.field_0,(short)lVar8 != 0);
            VVar5 = SetArrayTypeId((ValueType *)&local_64.field_0,typeId);
            MapInitialValueTypesUntil<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp:1913:31)>
            ::anon_class_8_1_54a39806::operator()(&local_60,VVar5,sVar7);
            lVar8 = lVar8 + 1;
          }
        }
        sVar9 = sVar7;
      }
    }
    sVar7 = sVar9;
  }
  return;
}

Assistant:

void ValueType::RunUnitTests()
{
    Assert(Uninitialized.bits == (Bits::Likely | Bits::CanBeTaggedValue));
    Assert(!ObjectType::UninitializedObject); // this is assumed in Merge

    const ValueType TaggedInt(GetTaggedInt());
    const ValueType IntAndLikelyTagged(GetInt(true));
    const ValueType IntAndLikelyUntagged(GetInt(false));

    Assert(TaggedInt.IsTaggedInt());
    Assert(TaggedInt.IsIntAndLikelyTagged());
    Assert(TaggedInt.IsLikelyTaggedInt());
    Assert(!TaggedInt.IsLikelyUntaggedInt());
    Assert(TaggedInt.IsInt());
    Assert(TaggedInt.IsLikelyInt());
    Assert(!TaggedInt.IsLikelyFloat());
    Assert(TaggedInt.IsNumber());
    Assert(TaggedInt.IsLikelyNumber());
    Assert(TaggedInt.IsPrimitive());
    Assert(TaggedInt.IsLikelyPrimitive());

    Assert(!IntAndLikelyTagged.IsTaggedInt());
    Assert(IntAndLikelyTagged.IsIntAndLikelyTagged());
    Assert(IntAndLikelyTagged.IsLikelyTaggedInt());
    Assert(!IntAndLikelyTagged.IsLikelyUntaggedInt());
    Assert(IntAndLikelyTagged.IsInt());
    Assert(IntAndLikelyTagged.IsLikelyInt());
    Assert(!IntAndLikelyTagged.IsLikelyFloat());
    Assert(IntAndLikelyTagged.IsNumber());
    Assert(IntAndLikelyTagged.IsLikelyNumber());
    Assert(IntAndLikelyTagged.IsPrimitive());
    Assert(IntAndLikelyTagged.IsLikelyPrimitive());

    Assert(GetNumberAndLikelyInt(true).IsLikelyTaggedInt());
    Assert(!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt());
    Assert(!GetNumberAndLikelyInt(true).IsInt());
    Assert(GetNumberAndLikelyInt(true).IsLikelyInt());
    Assert(!GetNumberAndLikelyInt(true).IsLikelyFloat());
    Assert(GetNumberAndLikelyInt(true).IsNumber());
    Assert(GetNumberAndLikelyInt(true).IsLikelyNumber());
    Assert(GetNumberAndLikelyInt(true).IsPrimitive());
    Assert(GetNumberAndLikelyInt(true).IsLikelyPrimitive());

    Assert(TaggedInt.ToLikely().IsLikelyTaggedInt());
    Assert(!TaggedInt.ToLikely().IsLikelyUntaggedInt());
    Assert(TaggedInt.ToLikely().IsLikelyInt());
    Assert(!TaggedInt.ToLikely().IsLikelyFloat());
    Assert(TaggedInt.ToLikely().IsLikelyNumber());
    Assert(!TaggedInt.ToLikely().IsPrimitive());
    Assert(TaggedInt.ToLikely().IsLikelyPrimitive());

    Assert(IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt());
    Assert(!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyInt());
    Assert(!IntAndLikelyTagged.ToLikely().IsLikelyFloat());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyNumber());
    Assert(!IntAndLikelyTagged.ToLikely().IsPrimitive());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyPrimitive());

    Assert(!IntAndLikelyUntagged.IsLikelyTaggedInt());
    Assert(IntAndLikelyUntagged.IsIntAndLikelyUntagged());
    Assert(IntAndLikelyUntagged.IsLikelyUntaggedInt());
    Assert(IntAndLikelyUntagged.IsInt());
    Assert(IntAndLikelyUntagged.IsLikelyInt());
    Assert(!IntAndLikelyUntagged.IsLikelyFloat());
    Assert(IntAndLikelyUntagged.IsNumber());
    Assert(IntAndLikelyUntagged.IsLikelyNumber());
    Assert(IntAndLikelyUntagged.IsPrimitive());
    Assert(IntAndLikelyUntagged.IsLikelyPrimitive());

    Assert(!GetNumberAndLikelyInt(false).IsLikelyTaggedInt());
    Assert(!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged());
    Assert(GetNumberAndLikelyInt(false).IsLikelyUntaggedInt());
    Assert(!GetNumberAndLikelyInt(false).IsInt());
    Assert(GetNumberAndLikelyInt(false).IsLikelyInt());
    Assert(!GetNumberAndLikelyInt(false).IsLikelyFloat());
    Assert(GetNumberAndLikelyInt(false).IsNumber());
    Assert(GetNumberAndLikelyInt(false).IsLikelyNumber());
    Assert(GetNumberAndLikelyInt(false).IsPrimitive());
    Assert(GetNumberAndLikelyInt(false).IsLikelyPrimitive());

    Assert(!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyInt());
    Assert(!IntAndLikelyUntagged.ToLikely().IsLikelyFloat());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyNumber());
    Assert(!IntAndLikelyUntagged.ToLikely().IsPrimitive());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive());

    Assert(!Float.IsLikelyInt());
    Assert(Float.IsFloat());
    Assert(Float.IsLikelyFloat());
    Assert(Float.IsNumber());
    Assert(Float.IsLikelyNumber());
    Assert(Float.IsPrimitive());
    Assert(Float.IsLikelyPrimitive());

    Assert(!Float.ToLikely().IsLikelyInt());
    Assert(Float.ToLikely().IsLikelyFloat());
    Assert(Float.ToLikely().IsLikelyNumber());
    Assert(!Float.ToLikely().IsPrimitive());
    Assert(!Float.ToLikely().IsPrimitive());
    Assert(Float.ToLikely().IsLikelyPrimitive());

    Assert(!Number.IsLikelyInt());
    Assert(!Number.IsLikelyFloat());
    Assert(Number.IsNumber());
    Assert(Number.IsUnknownNumber());
    Assert(Number.IsLikelyNumber());
    Assert(Number.IsPrimitive());
    Assert(Number.IsLikelyPrimitive());

    Assert(!Number.ToLikely().IsLikelyInt());
    Assert(!Number.ToLikely().IsLikelyFloat());
    Assert(Number.ToLikely().IsLikelyNumber());
    Assert(Number.ToLikely().IsLikelyUnknownNumber());
    Assert(!Number.ToLikely().IsPrimitive());
    Assert(Number.ToLikely().IsLikelyPrimitive());

    Assert(!UninitializedObject.IsLikelyPrimitive());
    Assert(UninitializedObject.IsObject());
    Assert(UninitializedObject.IsLikelyObject());

    Assert(!UninitializedObject.ToLikely().IsLikelyPrimitive());
    Assert(!UninitializedObject.ToLikely().IsObject());
    Assert(UninitializedObject.ToLikely().IsLikelyObject());

    Assert(Undefined.IsNotInt());
    Assert(!Undefined.ToLikely().IsNotInt());
    Assert(Null.IsNotInt());
    Assert(!Null.ToLikely().IsNotInt());
    Assert(Boolean.IsNotInt());
    Assert(!Boolean.ToLikely().IsNotInt());
    Assert(String.IsNotInt());
    Assert(!String.ToLikely().IsNotInt());
    Assert(UninitializedObject.IsNotInt());
    Assert(!UninitializedObject.ToLikely().IsNotInt());

    {
        const ValueType m(IntAndLikelyUntagged.Merge(Null));
        Assert(m.IsPrimitive());
        Assert(m.IsLikelyPrimitive());
        Assert(IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true));
    }

    {
        const ValueType m(IntAndLikelyUntagged.Merge(UninitializedObject));
        Assert(m.HasBeenInt());
        Assert(!m.IsLikelyPrimitive());
        Assert(m.HasBeenObject());
        Assert(!m.IsLikelyObject());
    }

    {
        const ValueType m(Uninitialized.Merge(IntAndLikelyTagged));
        Assert(!m.IsPrimitive());
        Assert(!m.IsDefinite());
        Assert(m.IsLikelyTaggedInt());
    }

    {
        const ValueType m(UninitializedObject.Merge(Null));
        Assert(UninitializedObject.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(UninitializedObject, true, true, true, true));
        Assert(Null.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(Null, true, true, true, true));
        Assert(!TaggedInt.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(TaggedInt, true, true, true, true));

        const ValueType po = m.Merge(TaggedInt);
        Assert(m.IsSubsetOf(po, true, true, true, true));
        Assert(!po.IsSubsetOf(m, true, true, true, true));
    }

    MapInitialValueTypesUntil([](const ValueType valueType0, const size_t i) -> bool
    {
        MapInitialValueTypesUntil([=](const ValueType t1, const size_t j) -> bool
        {
            if(j < i)
                return false;

            const ValueType t0(valueType0);
            const ValueType m(t0.Merge(t1));

            Assert(m.bits == t1.Merge(t0).bits);

            Assert(m.IsUninitialized() == (t0.IsUninitialized() && t1.IsUninitialized()));
            const bool isSubsetWithTypeSpecEnabled = t0.IsSubsetOf(t1, true, true, true, true);
            if(t0.IsUninitialized())
            {
                Assert(isSubsetWithTypeSpecEnabled == t1.IsUninitialized());
                return false;
            }
            else if(t1.IsUninitialized())
            {
                Assert(isSubsetWithTypeSpecEnabled);
                return false;
            }

            Assert(m.IsIntAndLikelyTagged() == (t0.IsIntAndLikelyTagged() && t1.IsIntAndLikelyTagged()));
            Assert(
                m.IsLikelyTaggedInt() ==
                (
                    t0.IsLikelyNumber() && t1.IsLikelyNumber() &&               // both are likely number
                    !t0.IsLikelyFloat() && !t1.IsLikelyFloat() &&               // neither is likely float
                    !t0.IsLikelyUntaggedInt() && !t1.IsLikelyUntaggedInt() &&   // neither is likely untagged int
                    (t0.IsLikelyTaggedInt() || t1.IsLikelyTaggedInt())          // one is likely tagged int
                ));

            Assert(m.IsInt() == (t0.IsInt() && t1.IsInt()));
            Assert(
                m.IsLikelyInt() ==
                (
                    t0.IsLikelyNumber() && t1.IsLikelyNumber() &&   // both are likely number
                    !t0.IsLikelyFloat() && !t1.IsLikelyFloat() &&   // neither is likely float
                    (t0.IsLikelyInt() || t1.IsLikelyInt())          // one is likely int
                ));

            if(!(
                    t0.IsObject() && t1.IsObject() &&                                                             // both are objects
                    (
                        (
                            (
                                t0.GetObjectType() == ObjectType::UninitializedObject ||
                                t1.GetObjectType() == ObjectType::UninitializedObject
                            ) &&                                                                                  // one has an uninitialized object type
                            (t0.GetObjectType() > ObjectType::Object || t1.GetObjectType() > ObjectType::Object)  // one has a specific object type
                        ) ||
                        (t0.IsArrayOrObjectWithArray() || t1.IsArrayOrObjectWithArray()) // or one was an array or an object with array
                    )
                ))                                                                                                // then the resulting object type is not guaranteed
            {
                Assert(m.IsNotInt() == (t0.IsNotInt() && t1.IsNotInt()));
            }

            Assert(m.IsFloat() == (t0.IsNumber() && t1.IsNumber() && (t0.IsFloat() || t1.IsFloat())));
            Assert(
                m.IsLikelyFloat() ==
                (
                    (t0.IsLikelyFloat() || t1.IsLikelyFloat()) &&       // one is likely float
                    (t0.IsLikelyUndefined() || t0.IsLikelyNumber()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNumber())     // both are likely undefined or number
                ));

            Assert(m.IsNumber() == (t0.IsNumber() && t1.IsNumber()));
            Assert(
                m.IsLikelyNumber() ==
                (
                    (t0.IsLikelyNumber() || t1.IsLikelyNumber()) &&     // one is likely number
                    (t0.IsLikelyUndefined() || t0.IsLikelyNumber()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNumber())     // both are likely undefined or number
                ));

            Assert(m.IsUnknownNumber() == (m.IsNumber() && !m.IsLikelyInt() && !m.IsLikelyFloat()));
            Assert(!m.IsLikelyUnknownNumber() || m.IsLikelyNumber() && !m.IsLikelyInt() && !m.IsLikelyFloat());

            Assert(m.IsUndefined() == (t0.IsUndefined() && t1.IsUndefined()));
            Assert(m.IsLikelyUndefined() == (t0.IsLikelyUndefined() && t1.IsLikelyUndefined()));

            Assert(m.IsNull() == (t0.IsNull() && t1.IsNull()));
            Assert(m.IsLikelyNull() == (t0.IsLikelyNull() && t1.IsLikelyNull()));

            Assert(m.IsBoolean() == (t0.IsBoolean() && t1.IsBoolean()));
            Assert(m.IsLikelyBoolean() == (t0.IsLikelyBoolean() && t1.IsLikelyBoolean()));

            Assert(m.IsString() == (t0.IsString() && t1.IsString()));
            Assert(m.IsLikelyString() == (t0.IsLikelyString() && t1.IsLikelyString()));

            if(!(
                    t0.IsObject() && t1.IsObject() &&                                                             // both are objects
                    (
                        (
                            (
                                t0.GetObjectType() == ObjectType::UninitializedObject ||
                                t1.GetObjectType() == ObjectType::UninitializedObject
                            ) &&                                                                                  // one has an uninitialized object type
                            (t0.GetObjectType() > ObjectType::Object || t1.GetObjectType() > ObjectType::Object)  // one has a specific object type
                        ) ||
                        (t0.IsArrayOrObjectWithArray() || t1.IsArrayOrObjectWithArray()) // or one was an array or an object with array
                    )
                ))                                                                                                // then the resulting object type is not guaranteed
            {
                Assert(m.IsObject() == (t0.IsObject() && t1.IsObject()));
            }
            Assert(
                m.IsLikelyObject() ==
                (
                    (t0.IsLikelyObject() || t1.IsLikelyObject()) &&                             // one is likely object
                    (t0.IsLikelyUndefined() || t0.IsLikelyNull() || t0.IsLikelyObject()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNull() || t1.IsLikelyObject())        // both are likely undefined, null, or object
                ));

            if(t1.IsUnknownNumber())
            {
                Assert(isSubsetWithTypeSpecEnabled == (t0.IsNumber() || t0.IsLikelyInt() || t0.IsLikelyFloat()));
                Assert(t0.IsSubsetOf(t1, false, true, true, true) == (t0.IsNumber() || t0.IsLikelyFloat()));
                Assert(t0.IsSubsetOf(t1, true, false, true, true) == (t0.IsNumber() || t0.IsLikelyInt()));
            }
            else if(t0.IsLikelyInt() && t1.IsLikelyInt())
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        (
                            t0.IsTaggedInt() ||
                            t0.IsLikelyTaggedInt() && !t1.IsTaggedInt() ||
                            !t1.IsLikelyTaggedInt()
                        )
                    ));
            }
            else if(t0.IsLikelyFloat() && t1.IsLikelyFloat())
            {
                Assert(isSubsetWithTypeSpecEnabled == (t0.IsDefinite() || !t1.IsDefinite()));
            }
            else if(t0.IsLikelyNumber() && t1.IsLikelyNumber())
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        (
                            t0.IsLikelyInt() && !t1.IsLikelyFloat() ||
                            t0.IsLikelyFloat() && !t1.IsLikelyInt() ||
                            t1.IsLikelyUnknownNumber()
                        )
                    ));
            }
            else if(t0.IsLikelyObject() && (t1.IsLikelyUndefined() || t1.IsLikelyNull()))
            {
                Assert(isSubsetWithTypeSpecEnabled);
            }
            else if(t0.IsLikelyObject() && t1.IsLikelyObject())
            {
                if(t1.GetObjectType() == ObjectType::UninitializedObject &&
                    t0.GetObjectType() != ObjectType::UninitializedObject)
                {
                    Assert(isSubsetWithTypeSpecEnabled);
                }
                else if((!t0.IsDefinite() && t1.IsDefinite()) || t0.GetObjectType() != t1.GetObjectType())
                {
                    Assert(!isSubsetWithTypeSpecEnabled);
                }
                else if(
                    (t0.IsDefinite() && !t1.IsDefinite()) ||
                    (t0.GetObjectType() != ObjectType::ObjectWithArray && t0.GetObjectType() != ObjectType::Array))
                {
                    Assert(isSubsetWithTypeSpecEnabled);
                }
                else
                {
                    Assert(
                        isSubsetWithTypeSpecEnabled ==
                        (
                            (t0.HasNoMissingValues() || !t1.HasNoMissingValues()) &&
                            (
                                (!t0.HasNonInts() || t1.HasNonInts()) && (!t0.HasNonFloats() || t1.HasNonFloats())
                            )
                        ));
                    Assert(
                        t0.IsSubsetOf(t1, true, true, false, true) ==
                        (
                            (!t0.HasNonInts() || t1.HasNonInts()) && (!t0.HasNonFloats() || t1.HasNonFloats())
                        ));
                    Assert(t0.IsSubsetOf(t1, true, true, false, false));
                }
            }
            else
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        !t0.IsLikelyObject() && !t1.IsLikelyObject() &&
                        t1.AllOn(t0.bits)
                    ));
            }

            return false;
        });
        return false;
    });
}